

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O2

void TPZCreateApproximationSpace::CreateInterfaceElements
               (TPZCompMesh *mesh,bool betweencontinuous,bool multiphysics)

{
  TPZCompEl *pTVar1;
  TPZCompEl **ppTVar2;
  TPZMultiphysicsElement *this;
  TPZInterpolationSpace *this_00;
  long lVar3;
  long nelem;
  TPZChunkVector<TPZCompEl_*,_10> compelvec;
  TPZChunkVector<TPZCompEl_*,_10> local_b0;
  
  TPZChunkVector<TPZCompEl_*,_10>::TPZChunkVector
            (&local_b0,&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>);
  nelem = 0;
  lVar3 = local_b0.fNElements;
  if (local_b0.fNElements < 1) {
    lVar3 = nelem;
  }
  for (; lVar3 != nelem; nelem = nelem + 1) {
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[](&local_b0,nelem);
    pTVar1 = *ppTVar2;
    if (pTVar1 != (TPZCompEl *)0x0) {
      if (multiphysics) {
        this = (TPZMultiphysicsElement *)
               __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0);
        if (this != (TPZMultiphysicsElement *)0x0) {
          TPZMultiphysicsElement::CreateInterfaces(this);
        }
      }
      else {
        this_00 = (TPZInterpolationSpace *)
                  __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
        if (this_00 != (TPZInterpolationSpace *)0x0) {
          TPZInterpolationSpace::CreateInterfaces(this_00,betweencontinuous);
        }
      }
    }
  }
  TPZChunkVector<TPZCompEl_*,_10>::~TPZChunkVector(&local_b0);
  return;
}

Assistant:

void TPZCreateApproximationSpace::CreateInterfaceElements(TPZCompMesh *mesh, bool betweencontinuous, bool multiphysics)
{
    TPZChunkVector<TPZCompEl *> compelvec = mesh->ElementVec();
    int64_t nel = compelvec.NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = compelvec[el];
        if (!cel) {
            continue;
        }
        if(!multiphysics)
        {
            TPZInterpolationSpace *intel = dynamic_cast<TPZInterpolationSpace *>(cel);
            if (intel) {
                intel->CreateInterfaces(betweencontinuous);
            }
        }
        else {
            TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(cel);
            if (!mfcel) {
                continue;
            }
            mfcel->CreateInterfaces();
        }
        
    }
}